

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation_statistics_helper.cpp
# Opt level: O2

RelationStats *
duckdb::RelationStatisticsHelper::ExtractProjectionStats
          (RelationStats *__return_storage_ptr__,LogicalProjection *proj,RelationStats *child_stats)

{
  undefined8 __n;
  bool bVar1;
  pointer pEVar2;
  type expr;
  ulong uVar3;
  reference __x;
  pointer this;
  ExpressionBinding res;
  undefined1 local_80 [32];
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_60;
  pointer local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  RelationStats::RelationStats(__return_storage_ptr__);
  __return_storage_ptr__->cardinality = child_stats->cardinality;
  (*(proj->super_LogicalOperator)._vptr_LogicalOperator[3])(&local_50,proj);
  ::std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->table_name,(string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_50);
  this = (proj->super_LogicalOperator).expressions.
         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  local_58 = (proj->super_LogicalOperator).expressions.
             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_60 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &__return_storage_ptr__->column_names;
  do {
    if (this == local_58) {
      __return_storage_ptr__->stats_initialized = true;
      return __return_storage_ptr__;
    }
    pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(this);
    (*(pEVar2->super_BaseExpression)._vptr_BaseExpression[7])(&local_50,pEVar2);
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(local_60,&local_50);
    ::std::__cxx11::string::~string((string *)&local_50);
    expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (this);
    GetChildColumnBinding((ExpressionBinding *)&local_50,expr);
    __n = local_50.field_2._M_allocated_capacity;
    if (local_50.field_2._M_local_buf[8] == '\x01') {
      local_80._0_8_ = (pointer)0x1;
      local_80[8] = true;
      ::std::vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>::
      emplace_back<duckdb::DistinctCount>
                ((vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_> *)
                 __return_storage_ptr__,(DistinctCount *)local_80);
    }
    else {
      uVar3 = (long)(child_stats->column_distinct_count).
                    super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
                    super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(child_stats->column_distinct_count).
                    super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
                    super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      if (uVar3 <= local_50.field_2._M_allocated_capacity) {
        pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(this);
        (*(pEVar2->super_BaseExpression)._vptr_BaseExpression[8])
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                   pEVar2);
        bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_80,"count_star()");
        ::std::__cxx11::string::~string((string *)local_80);
        if (bVar1) {
          local_80._0_8_ = (pointer)0x1;
          local_80[8] = true;
          ::std::vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>::
          emplace_back<duckdb::DistinctCount>
                    ((vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_> *)
                     __return_storage_ptr__,(DistinctCount *)local_80);
          goto LAB_00a3f84b;
        }
        uVar3 = (long)(child_stats->column_distinct_count).
                      super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
                      super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(child_stats->column_distinct_count).
                      super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
                      super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4;
      }
      if ((ulong)__n < uVar3) {
        __x = ::std::vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>::at
                        ((vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_> *)
                         child_stats,__n);
        ::std::vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>::push_back
                  ((vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_> *)
                   __return_storage_ptr__,__x);
      }
      else {
        local_80._0_8_ = __return_storage_ptr__->cardinality;
        local_80[8] = false;
        ::std::vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>::
        emplace_back<duckdb::DistinctCount>
                  ((vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_> *)
                   __return_storage_ptr__,(DistinctCount *)local_80);
      }
    }
LAB_00a3f84b:
    this = this + 1;
  } while( true );
}

Assistant:

RelationStats RelationStatisticsHelper::ExtractProjectionStats(LogicalProjection &proj, RelationStats &child_stats) {
	auto proj_stats = RelationStats();
	proj_stats.cardinality = child_stats.cardinality;
	proj_stats.table_name = proj.GetName();
	for (auto &expr : proj.expressions) {
		proj_stats.column_names.push_back(expr->GetName());
		auto res = GetChildColumnBinding(*expr);
		D_ASSERT(res.found_expression);
		if (res.expression_is_constant) {
			proj_stats.column_distinct_count.push_back(DistinctCount({1, true}));
		} else {
			auto column_index = res.child_binding.column_index;
			if (column_index >= child_stats.column_distinct_count.size() && expr->ToString() == "count_star()") {
				// only one value for a count star
				proj_stats.column_distinct_count.push_back(DistinctCount({1, true}));
			} else {
				// TODO: add this back in
				//	D_ASSERT(column_index < stats.column_distinct_count.size());
				if (column_index < child_stats.column_distinct_count.size()) {
					proj_stats.column_distinct_count.push_back(child_stats.column_distinct_count.at(column_index));
				} else {
					proj_stats.column_distinct_count.push_back(DistinctCount({proj_stats.cardinality, false}));
				}
			}
		}
	}
	proj_stats.stats_initialized = true;
	return proj_stats;
}